

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O3

void __thiscall
slang::ast::StructurePattern::serializeTo(StructurePattern *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer pFVar2;
  FieldPattern *fp;
  pointer pFVar3;
  string_view name;
  string_view name_00;
  
  name._M_str = "patterns";
  name._M_len = 8;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->patterns)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pFVar3 = (this->patterns)._M_ptr;
    pFVar2 = pFVar3 + sVar1;
    do {
      ASTSerializer::startObject(serializer);
      name_00._M_str = "field";
      name_00._M_len = 5;
      ASTSerializer::writeLink(serializer,name_00,(Symbol *)(pFVar3->field).ptr);
      ASTSerializer::write(serializer,7,"pattern",(size_t)(pFVar3->pattern).ptr);
      ASTSerializer::endObject(serializer);
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != pFVar2);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void StructurePattern::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("patterns");
    for (auto& fp : patterns) {
        serializer.startObject();
        serializer.writeLink("field", *fp.field);
        serializer.write("pattern", *fp.pattern);
        serializer.endObject();
    }
    serializer.endArray();
}